

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int addk(FuncState *fs,Proto *f,TValue *v)

{
  byte bVar1;
  int nelems;
  int iVar2;
  lua_State *L;
  TValue *pTVar3;
  lu_byte *plVar4;
  long lVar5;
  
  L = fs->ls->L;
  lVar5 = (long)f->sizek;
  nelems = fs->nk;
  pTVar3 = (TValue *)luaM_growaux_(L,f->k,nelems,&f->sizek,0x10,0x1ffffff,"constants");
  f->k = pTVar3;
  iVar2 = f->sizek;
  plVar4 = &pTVar3[lVar5].tt_;
  for (; lVar5 < iVar2; lVar5 = lVar5 + 1) {
    *plVar4 = '\0';
    plVar4 = plVar4 + 0x10;
  }
  pTVar3[nelems].value_ = v->value_;
  bVar1 = v->tt_;
  pTVar3[nelems].tt_ = bVar1;
  fs->nk = fs->nk + 1;
  if ((((bVar1 & 0x40) != 0) && ((f->marked & 0x20) != 0)) &&
     ((((v->value_).gc)->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)f,(v->value_).gc);
  }
  return nelems;
}

Assistant:

static int addk (FuncState *fs, Proto *f, TValue *v) {
  lua_State *L = fs->ls->L;
  int oldsize = f->sizek;
  int k = fs->nk;
  luaM_growvector(L, f->k, k, f->sizek, TValue, MAXARG_Ax, "constants");
  while (oldsize < f->sizek)
    setnilvalue(&f->k[oldsize++]);
  setobj(L, &f->k[k], v);
  fs->nk++;
  luaC_barrier(L, f, v);
  return k;
}